

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

Vector3D * __thiscall CMU462::Vertex::normal(Vector3D *__return_storage_ptr__,Vertex *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  _List_node_base *p_Var8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector3D local_38;
  
  __return_storage_ptr__->z = 0.0;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  dVar1 = (this->position).x;
  dVar5 = (this->position).y;
  dVar6 = (this->position).z;
  p_Var8 = (this->_halfedge)._M_node;
  bVar7 = isBoundary(this);
  if (bVar7) {
    do {
      p_Var2 = p_Var8[2]._M_next[2]._M_prev;
      p_Var3 = p_Var8[2]._M_next[2]._M_next[2]._M_prev;
      dVar10 = (double)p_Var3[2]._M_prev - dVar6;
      dVar11 = (double)p_Var3[1]._M_prev - dVar1;
      dVar4 = (double)p_Var2[1]._M_prev - dVar1;
      dVar9 = (double)p_Var3[2]._M_next - dVar5;
      dVar12 = (double)p_Var2[2]._M_next - dVar5;
      dVar13 = (double)p_Var2[2]._M_prev - dVar6;
      local_38.x = dVar12 * dVar10 - dVar9 * dVar13;
      local_38.y = dVar13 * dVar11 - dVar10 * dVar4;
      local_38.z = dVar4 * dVar9 - dVar11 * dVar12;
      Vector3D::operator+=(__return_storage_ptr__,&local_38);
      p_Var8 = p_Var8[2]._M_next[1]._M_prev;
    } while (p_Var8 != (this->_halfedge)._M_node);
  }
  else {
    do {
      p_Var2 = p_Var8[2]._M_next[2]._M_prev;
      p_Var3 = p_Var8[2]._M_next[2]._M_next[2]._M_prev;
      dVar10 = (double)p_Var3[2]._M_prev - dVar6;
      dVar11 = (double)p_Var3[1]._M_prev - dVar1;
      dVar4 = (double)p_Var2[1]._M_prev - dVar1;
      dVar9 = (double)p_Var3[2]._M_next - dVar5;
      dVar12 = (double)p_Var2[2]._M_next - dVar5;
      dVar13 = (double)p_Var2[2]._M_prev - dVar6;
      local_38.x = dVar12 * dVar10 - dVar9 * dVar13;
      local_38.y = dVar13 * dVar11 - dVar10 * dVar4;
      local_38.z = dVar4 * dVar9 - dVar11 * dVar12;
      Vector3D::operator+=(__return_storage_ptr__,&local_38);
      p_Var8 = p_Var8[1]._M_prev[2]._M_next;
    } while (p_Var8 != (this->_halfedge)._M_node);
  }
  Vector3D::normalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Vector3D normal() const {
          Vector3D N( 0., 0., 0. );
          Vector3D pi = position;

          // Iterate over neighbors.
          HalfedgeCIter h = halfedge();
          if (isBoundary()) {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->next()->twin();
            } while( h != halfedge() );      
          } else {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->twin()->next();
            } while( h != halfedge() );
          }

          N.normalize();

          return N;
        }